

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O1

void __thiscall chrono::ChForce::ChForce(ChForce *this,ChForce *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double dVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  ChObj::ChObj(&this->super_ChObj,&other->super_ChObj);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChForce_00b2b848;
  (this->vpoint).m_data[0] = 0.0;
  (this->vpoint).m_data[1] = 0.0;
  (this->vpoint).m_data[2] = 0.0;
  (this->vrelpoint).m_data[0] = 0.0;
  (this->vrelpoint).m_data[1] = 0.0;
  (this->vrelpoint).m_data[2] = 0.0;
  (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->restpos).m_data[0] = 0.0;
  (this->restpos).m_data[1] = 0.0;
  (this->restpos).m_data[2] = 0.0;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->restpos).m_data[1] = 0.0;
  (this->restpos).m_data[2] = 0.0;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->vdir).m_data[0] = 0.0;
  (this->vdir).m_data[1] = 0.0;
  (this->vdir).m_data[2] = 0.0;
  (this->vreldir).m_data[0] = 0.0;
  (this->vreldir).m_data[1] = 0.0;
  (this->vreldir).m_data[2] = 0.0;
  (this->vreldir).m_data[1] = 0.0;
  (this->vreldir).m_data[2] = 0.0;
  (this->force).m_data[0] = 0.0;
  (this->force).m_data[1] = 0.0;
  (this->force).m_data[2] = 0.0;
  (this->relforce).m_data[0] = 0.0;
  (this->relforce).m_data[1] = 0.0;
  (this->relforce).m_data[2] = 0.0;
  this->Body = other->Body;
  this->mforce = other->mforce;
  if (other != this) {
    (this->force).m_data[0] = (other->force).m_data[0];
    (this->force).m_data[1] = (other->force).m_data[1];
    (this->force).m_data[2] = (other->force).m_data[2];
    (this->relforce).m_data[0] = (other->relforce).m_data[0];
    (this->relforce).m_data[1] = (other->relforce).m_data[1];
    (this->relforce).m_data[2] = (other->relforce).m_data[2];
    (this->vdir).m_data[0] = (other->vdir).m_data[0];
    (this->vdir).m_data[1] = (other->vdir).m_data[1];
    (this->vdir).m_data[2] = (other->vdir).m_data[2];
    (this->vreldir).m_data[0] = (other->vreldir).m_data[0];
    (this->vreldir).m_data[1] = (other->vreldir).m_data[1];
    (this->vreldir).m_data[2] = (other->vreldir).m_data[2];
    (this->vpoint).m_data[0] = (other->vpoint).m_data[0];
    (this->vpoint).m_data[1] = (other->vpoint).m_data[1];
    (this->vpoint).m_data[2] = (other->vpoint).m_data[2];
    (this->vrelpoint).m_data[0] = (other->vrelpoint).m_data[0];
    (this->vrelpoint).m_data[1] = (other->vrelpoint).m_data[1];
    (this->vrelpoint).m_data[2] = (other->vrelpoint).m_data[2];
    (this->restpos).m_data[0] = (other->restpos).m_data[0];
    (this->restpos).m_data[1] = (other->restpos).m_data[1];
    (this->restpos).m_data[2] = (other->restpos).m_data[2];
  }
  this->align = other->align;
  this->frame = other->frame;
  this->mode = other->mode;
  (this->super_ChObj).ChTime = (other->super_ChObj).ChTime;
  dVar2 = (other->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
          array[1];
  (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[0]
       = (other->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
         array[0];
  (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[1]
       = dVar2;
  dVar2 = (other->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
          array[3];
  (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[2]
       = (other->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
         array[2];
  (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[3]
       = dVar2;
  dVar2 = (other->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
          array[5];
  (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[4]
       = (other->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
         array[4];
  (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[5]
       = dVar2;
  (this->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[6]
       = (other->Qf).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
         array[6];
  iVar4 = (*((other->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var,iVar4));
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var,iVar4);
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar4 = (*((other->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_00,iVar4));
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_00,iVar4);
  (this->move_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar4 = (*((other->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_01,iVar4));
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_01,iVar4);
  (this->move_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar4 = (*((other->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_02,iVar4));
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_02,iVar4);
  (this->move_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar4 = (*((other->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_03,iVar4));
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_03,iVar4);
  (this->f_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar4 = (*((other->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_04,iVar4));
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_04,iVar4);
  (this->f_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  iVar4 = (*((other->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var_05,iVar4));
  _Var3._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var_05,iVar4);
  (this->f_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return;
}

Assistant:

ChForce::ChForce(const ChForce& other) : ChObj(other) {
    Body = other.Body;

    mforce = other.mforce;
    force = other.force;
    relforce = other.relforce;
    vdir = other.vdir;
    vreldir = other.vreldir;
    vpoint = other.vpoint;
    vrelpoint = other.vrelpoint;
    restpos = other.restpos;
    align = other.align;
    frame = other.frame;
    mode = other.mode;

    ChTime = other.ChTime;

    Qf = other.Qf;

    modula = std::shared_ptr<ChFunction>(other.modula->Clone());

    move_x = std::shared_ptr<ChFunction>(other.move_x->Clone());
    move_y = std::shared_ptr<ChFunction>(other.move_y->Clone());
    move_z = std::shared_ptr<ChFunction>(other.move_z->Clone());

    f_x = std::shared_ptr<ChFunction>(other.f_x->Clone());
    f_y = std::shared_ptr<ChFunction>(other.f_y->Clone());
    f_z = std::shared_ptr<ChFunction>(other.f_z->Clone());
}